

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 soft_f32_sqrt(float32 a,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  FloatParts part;
  FloatParts FVar10;
  
  part._8_8_ = (ulong)(a >> 0x17) & 0xff | (ulong)(a & 0x80000000) << 9;
  part.frac = (ulong)(a & 0x7fffff);
  FVar10 = sf_canonicalize(part,&float32_params,status);
  if (((undefined1  [16])FVar10 & (undefined1  [16])0xfc00000000) == (undefined1  [16])0x0) {
    uVar5 = FVar10._12_4_ & 3;
    if (uVar5 != 1) {
      if ((FVar10._8_8_ >> 0x28 & 1) == 0) {
        if (uVar5 == 2) {
          uVar4 = FVar10.frac >> (~(byte)FVar10.exp & 1);
          uVar6 = 0x3e;
          lVar7 = 0;
          lVar8 = 0;
          do {
            uVar6 = uVar6 - 1;
            uVar9 = 1L << ((byte)uVar6 & 0x3f);
            uVar1 = uVar9 + lVar8;
            uVar2 = 0;
            uVar3 = 0;
            if (uVar1 <= uVar4) {
              lVar8 = uVar1 + uVar9;
              uVar2 = uVar1;
              uVar3 = uVar9;
            }
            lVar7 = lVar7 + uVar3;
            uVar4 = (uVar4 - uVar2) * 2;
          } while (0x23 < uVar6);
          uVar6 = FVar10._8_8_ & 0xfffffe0300000000 | (ulong)(uint)(FVar10.exp >> 1);
          FVar10.exp = (int)uVar6;
          FVar10.cls = (char)(uVar6 >> 0x20);
          FVar10.sign = (_Bool)(char)(uVar6 >> 0x28);
          FVar10._14_2_ = (short)(uVar6 >> 0x30);
          FVar10.frac = (ulong)(uVar4 != 0) + lVar7 * 2;
        }
        else if (uVar5 != 3) {
          __assert_fail("a.cls == float_class_normal",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                        ,0xc5f,"FloatParts sqrt_float(FloatParts, float_status *, const FloatFmt *)"
                       );
        }
      }
      else {
        status->float_exception_flags = status->float_exception_flags | 1;
        FVar10.exp = 0x7fffffff;
        FVar10.cls = float_class_qnan;
        FVar10.sign = false;
        FVar10._14_2_ = 0;
        FVar10.frac = 0x2000000000000000;
      }
    }
  }
  else {
    FVar10 = return_nan(FVar10,status);
  }
  FVar10 = round_canonical(FVar10,status,&float32_params);
  return (uint)FVar10.frac & 0x7fffff | (FVar10.exp & 0xffU) << 0x17 |
         (uint)(FVar10._8_8_ >> 9) & 0x80000000;
}

Assistant:

static float32 QEMU_SOFTFLOAT_ATTR
soft_f32_sqrt(float32 a, float_status *status)
{
    FloatParts pa = float32_unpack_canonical(a, status);
    FloatParts pr = sqrt_float(pa, status, &float32_params);
    return float32_round_pack_canonical(pr, status);
}